

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::TypeSpecializeFloatDst
          (GlobOpt *this,Instr *instr,Value *valToTransfer,Value *src1Value,Value *src2Value,
          Value **pDstVal)

{
  RegOpnd *dst;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  Value *pVVar5;
  
  dst = (RegOpnd *)instr->m_dst;
  if (dst == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x299c,"(dst)","dst");
    if (!bVar2) goto LAB_00454ba5;
    *puVar4 = 0;
  }
  OVar3 = IR::Opnd::GetKind((Opnd *)dst);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x299e,"(dst->IsRegOpnd())","What else?");
    if (!bVar2) goto LAB_00454ba5;
    *puVar4 = 0;
  }
  OVar3 = IR::Opnd::GetKind((Opnd *)dst);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar2) {
LAB_00454ba5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  ToFloat64Dst(this,instr,dst,this->currentBlock);
  if (valToTransfer != (Value *)0x0) {
    if (this->prePassLoop != (Loop *)0x0) {
      valToTransfer = ValueNumberTransferDstInPrepass(this,instr,valToTransfer);
    }
    *pDstVal = valToTransfer;
    GlobOptBlockData::InsertNewValue(&this->currentBlock->globOptData,valToTransfer,(Opnd *)dst);
    return;
  }
  pVVar5 = CreateDstUntransferredValue(this,(ValueType)0x108,instr,src1Value,src2Value);
  *pDstVal = pVVar5;
  return;
}

Assistant:

void
GlobOpt::TypeSpecializeFloatDst(IR::Instr *instr, Value *valToTransfer, Value *const src1Value, Value *const src2Value, Value **pDstVal)
{
    IR::Opnd* dst = instr->GetDst();
    Assert(dst);

    AssertMsg(dst->IsRegOpnd(), "What else?");
    this->ToFloat64Dst(instr, dst->AsRegOpnd(), this->currentBlock);

    if(valToTransfer)
    {
        *pDstVal = this->ValueNumberTransferDst(instr, valToTransfer);
        CurrentBlockData()->InsertNewValue(*pDstVal, dst);
    }
    else
    {
        *pDstVal = CreateDstUntransferredValue(ValueType::Float, instr, src1Value, src2Value);
    }
}